

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  size_t __n;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  pointer __s2;
  pointer __s1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view message;
  string local_98;
  undefined8 local_78;
  char *local_70;
  size_t local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  size_t local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  __n = (this->tokenizer_).current_.text._M_string_length;
  sVar1 = value->_M_string_length;
  if (__n == sVar1) {
    if (__n != 0) {
      __s2 = (value->_M_dataplus)._M_p;
      __s1 = (this->tokenizer_).current_.text._M_dataplus._M_p;
      iVar3 = bcmp(__s1,__s2,__n);
      if (iVar3 != 0) goto LAB_003005d3;
    }
    io::Tokenizer::Next(&this->tokenizer_);
    bVar2 = true;
  }
  else {
    __s2 = (value->_M_dataplus)._M_p;
    __s1 = (this->tokenizer_).current_.text._M_dataplus._M_p;
LAB_003005d3:
    local_78 = 10;
    local_70 = "Expected \"";
    local_58 = 10;
    local_50 = "\", found \"";
    local_38 = 2;
    local_30 = "\".";
    pieces._M_len = (size_type)"Expected \"";
    pieces._M_array = (iterator)0x5;
    local_68 = sVar1;
    local_60 = __s2;
    local_48 = __n;
    local_40 = __s1;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (&local_98,(strings_internal *)&local_78,pieces);
    message._M_str = local_98._M_dataplus._M_p;
    message._M_len = local_98._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Consume(const std::string& value) {
    const std::string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError(absl::StrCat("Expected \"", value, "\", found \"",
                               current_value, "\"."));
      return false;
    }

    tokenizer_.Next();

    return true;
  }